

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O0

void av1_dealloc_mb_data(macroblock *mb,int num_planes)

{
  undefined4 in_ESI;
  long in_RDI;
  int in_stack_ffffffffffffffec;
  undefined4 in_stack_fffffffffffffff0;
  
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x25610) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x1c640) = 0;
  av1_dealloc_src_diff_buf
            ((macroblock *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffec);
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x2bb0) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x1c630) = 0;
  aom_free((void *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  *(undefined8 *)(in_RDI + 0x25638) = 0;
  return;
}

Assistant:

static inline void av1_dealloc_mb_data(struct macroblock *mb, int num_planes) {
  aom_free(mb->txfm_search_info.mb_rd_record);
  mb->txfm_search_info.mb_rd_record = NULL;

  aom_free(mb->inter_modes_info);
  mb->inter_modes_info = NULL;

  av1_dealloc_src_diff_buf(mb, num_planes);

  aom_free(mb->e_mbd.seg_mask);
  mb->e_mbd.seg_mask = NULL;

  aom_free(mb->winner_mode_stats);
  mb->winner_mode_stats = NULL;

  aom_free(mb->dqcoeff_buf);
  mb->dqcoeff_buf = NULL;
}